

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

CBlockIndex * LastCommonAncestor(CBlockIndex *pa,CBlockIndex *pb)

{
  CBlockIndex *in_RSI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  bool bVar1;
  CBlockIndex *unaff_retaddr;
  CBlockIndex *local_18;
  CBlockIndex *local_10;
  int height;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  height = (int)((ulong)lVar2 >> 0x20);
  local_18 = in_RSI;
  if (in_RSI->nHeight < in_RDI->nHeight) {
    local_10 = CBlockIndex::GetAncestor(unaff_retaddr,height);
  }
  else {
    local_10 = in_RDI;
    if (in_RDI->nHeight < in_RSI->nHeight) {
      local_18 = CBlockIndex::GetAncestor(unaff_retaddr,height);
    }
  }
  while( true ) {
    bVar1 = false;
    if ((local_10 != local_18) && (bVar1 = false, local_10 != (CBlockIndex *)0x0)) {
      bVar1 = local_18 != (CBlockIndex *)0x0;
    }
    if (!bVar1) break;
    local_10 = local_10->pprev;
    local_18 = local_18->pprev;
  }
  if (local_10 != local_18) {
    __assert_fail("pa == pb",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.cpp"
                  ,0xb2,
                  "const CBlockIndex *LastCommonAncestor(const CBlockIndex *, const CBlockIndex *)")
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

const CBlockIndex* LastCommonAncestor(const CBlockIndex* pa, const CBlockIndex* pb) {
    if (pa->nHeight > pb->nHeight) {
        pa = pa->GetAncestor(pb->nHeight);
    } else if (pb->nHeight > pa->nHeight) {
        pb = pb->GetAncestor(pa->nHeight);
    }

    while (pa != pb && pa && pb) {
        pa = pa->pprev;
        pb = pb->pprev;
    }

    // Eventually all chain branches meet at the genesis block.
    assert(pa == pb);
    return pa;
}